

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O2

int __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateFieldAccessorTableInitializer
          (ImmutableMessageGenerator *this,Printer *printer)

{
  FieldGeneratorInfo *pFVar1;
  Descriptor *pDVar2;
  OneofGeneratorInfo *pOVar3;
  Descriptor *in_RDX;
  int iVar4;
  long lVar5;
  int i;
  long lVar6;
  string local_70;
  string local_50;
  
  UniqueFileScopeIdentifier_abi_cxx11_
            (&local_50,(java *)(this->super_MessageGenerator).descriptor_,in_RDX);
  GeneratedCodeVersionSuffix_abi_cxx11_();
  io::Printer::Print(printer,
                     "internal_$identifier$_fieldAccessorTable = new\n  com.google.protobuf.GeneratedMessage$ver$.FieldAccessorTable(\n    internal_$identifier$_descriptor,\n    new java.lang.String[] { "
                     ,"identifier",&local_50,"ver",&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  iVar4 = 10;
  lVar5 = 0;
  for (lVar6 = 0; pDVar2 = (this->super_MessageGenerator).descriptor_,
      lVar6 < *(int *)(pDVar2 + 0x2c); lVar6 = lVar6 + 1) {
    pFVar1 = Context::GetFieldGeneratorInfo
                       (this->context_,(FieldDescriptor *)(*(long *)(pDVar2 + 0x30) + lVar5));
    iVar4 = iVar4 + 6;
    io::Printer::Print(printer,"\"$field_name$\", ","field_name",&pFVar1->capitalized_name);
    lVar5 = lVar5 + 0xa8;
  }
  lVar5 = 0;
  for (lVar6 = 0; lVar6 < *(int *)(pDVar2 + 0x38); lVar6 = lVar6 + 1) {
    pOVar3 = Context::GetOneofGeneratorInfo
                       (this->context_,(OneofDescriptor *)(*(long *)(pDVar2 + 0x40) + lVar5));
    iVar4 = iVar4 + 6;
    io::Printer::Print(printer,"\"$oneof_name$\", ","oneof_name",&pOVar3->capitalized_name);
    pDVar2 = (this->super_MessageGenerator).descriptor_;
    lVar5 = lVar5 + 0x30;
  }
  io::Printer::Print(printer,"});\n");
  return iVar4;
}

Assistant:

int ImmutableMessageGenerator::
GenerateFieldAccessorTableInitializer(io::Printer* printer) {
  int bytecode_estimate = 10;
  printer->Print(
    "internal_$identifier$_fieldAccessorTable = new\n"
    "  com.google.protobuf.GeneratedMessage$ver$.FieldAccessorTable(\n"
    "    internal_$identifier$_descriptor,\n"
    "    new java.lang.String[] { ",
    "identifier", UniqueFileScopeIdentifier(descriptor_),
    "ver", GeneratedCodeVersionSuffix());
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);
    bytecode_estimate += 6;
    printer->Print(
      "\"$field_name$\", ",
      "field_name", info->capitalized_name);
  }
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = descriptor_->oneof_decl(i);
    const OneofGeneratorInfo* info = context_->GetOneofGeneratorInfo(oneof);
    bytecode_estimate += 6;
    printer->Print(
      "\"$oneof_name$\", ",
      "oneof_name", info->capitalized_name);
  }
  printer->Print("});\n");
  return bytecode_estimate;
}